

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * string_format_abi_cxx11_(char *fmt,...)

{
  char in_AL;
  size_type __n;
  char *pcVar1;
  ulong uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auVar3 [12];
  int size2;
  vector<char,_std::allocator<char>_> buf;
  int size;
  va_list ap2;
  va_list ap;
  allocator_type *in_stack_fffffffffffffea0;
  allocator *this;
  vector<char,_std::allocator<char>_> *this_00;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  allocator local_81;
  int local_80;
  undefined4 local_7c;
  undefined8 local_78;
  vector<char,_std::allocator<char>_> local_69;
  int local_4c;
  undefined8 local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined1 *puStack_20;
  undefined1 *local_18;
  char *local_10;
  string *local_8;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Da;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_38 = local_138;
  puStack_40 = &stack0x00000008;
  uStack_24 = 0x30;
  local_28 = 0x10;
  local_48 = 0x3000000010;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  puStack_20 = puStack_40;
  local_18 = local_38;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_4c = vsnprintf((char *)0x0,0,in_RSI,&local_28);
  if ((local_4c < 0) || (0x7ffffffe < local_4c)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
               ,0x188,"GGML_ASSERT(%s) failed","size >= 0 && size < INT_MAX");
  }
  __n = (size_type)(local_4c + 1);
  this_00 = &local_69;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(this_00,__n,in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x340591);
  local_80 = vsnprintf(pcVar1,(long)(local_4c + 1),local_10,&local_48);
  if (local_80 != local_4c) {
    auVar3 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                        ,0x18b,"GGML_ASSERT(%s) failed","size2 == size");
    local_7c = auVar3._8_4_;
    local_78 = auVar3._0_8_;
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    _Unwind_Resume(local_78);
  }
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x34063c);
  uVar2 = (ulong)local_4c;
  this = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,this);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)this);
  return in_RDI;
}

Assistant:

std::string string_format(const char * fmt, ...) {
    va_list ap;
    va_list ap2;
    va_start(ap, fmt);
    va_copy(ap2, ap);
    int size = vsnprintf(NULL, 0, fmt, ap);
    GGML_ASSERT(size >= 0 && size < INT_MAX); // NOLINT
    std::vector<char> buf(size + 1);
    int size2 = vsnprintf(buf.data(), size + 1, fmt, ap2);
    GGML_ASSERT(size2 == size);
    va_end(ap2);
    va_end(ap);
    return std::string(buf.data(), size);
}